

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O1

uint32_t helper_efsctuf(CPUPPCState_conflict *env,uint32_t val)

{
  int iVar1;
  float32 fVar2;
  uint32_t uVar3;
  float_status *status;
  
  status = &env->vec_status;
  iVar1 = float32_is_quiet_nan_ppc(val,status);
  if (iVar1 == 0) {
    fVar2 = uint64_to_float32_ppc(0x100000000,status);
    fVar2 = float32_mul_ppc(val,fVar2,status);
    uVar3 = float32_to_uint32_ppc(fVar2,status);
    return uVar3;
  }
  return 0;
}

Assistant:

static inline uint32_t efsctuf(CPUPPCState *env, uint32_t val)
{
    CPU_FloatU u;
    float32 tmp;

    u.l = val;
    /* NaN are not treated the same way IEEE 754 does */
    if (unlikely(float32_is_quiet_nan(u.f, &env->vec_status))) {
        return 0;
    }
    tmp = uint64_to_float32(1ULL << 32, &env->vec_status);
    u.f = float32_mul(u.f, tmp, &env->vec_status);

    return float32_to_uint32(u.f, &env->vec_status);
}